

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_paeth_predictor_4x16_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 uVar12;
  ulong uVar13;
  undefined8 *in_RCX;
  uint *in_RDX;
  long in_RSI;
  undefined4 *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  __m128i row;
  __m128i l16;
  int i;
  __m128i one;
  __m128i rep;
  __m128i tl16;
  __m128i t16;
  __m128i zero;
  __m128i t;
  __m128i l;
  __m128i local_208;
  int local_1ec;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  ulong local_1c8;
  ulong uStack_1c0;
  undefined1 local_1b8;
  undefined1 uStack_1b7;
  undefined1 uStack_1b6;
  undefined1 uStack_1b5;
  undefined1 uStack_1b4;
  undefined1 uStack_1b3;
  undefined1 uStack_1b2;
  undefined1 uStack_1b1;
  undefined1 uStack_1b0;
  undefined1 uStack_1af;
  undefined1 uStack_1ae;
  undefined1 uStack_1ad;
  undefined1 uStack_1ac;
  undefined1 uStack_1ab;
  undefined1 uStack_1aa;
  undefined1 uStack_1a9;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  ulong local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  long local_168;
  undefined4 *local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined2 local_11e;
  undefined2 local_11c;
  ushort local_11a;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  char local_e8;
  char cStack_e7;
  char cStack_e6;
  char cStack_e5;
  char cStack_e4;
  char cStack_e3;
  char cStack_e2;
  char cStack_e1;
  char cStack_e0;
  char cStack_df;
  char cStack_de;
  char cStack_dd;
  char cStack_dc;
  char cStack_db;
  char cStack_da;
  char cStack_d9;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_88 [16];
  uint local_6c;
  ulong local_68;
  ulong uStack_60;
  ushort local_58;
  ushort local_56;
  ushort local_54;
  ushort local_52;
  ushort local_50;
  ushort local_4e;
  ushort local_4c;
  ushort local_4a;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined2 local_2e;
  undefined2 local_2c;
  undefined2 local_2a;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  local_188 = *in_RCX;
  uStack_180 = in_RCX[1];
  local_6c = *in_RDX;
  local_88._4_4_ = 0;
  local_88._0_4_ = local_6c;
  local_198 = local_88._0_8_;
  uStack_190 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_138 = local_88._0_8_;
  uVar13 = local_138;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_138._0_1_ = (undefined1)local_6c;
  local_138._1_1_ = (undefined1)(local_6c >> 8);
  local_138._2_1_ = (undefined1)(local_6c >> 0x10);
  local_138._3_1_ = (undefined1)(local_6c >> 0x18);
  local_1b8 = (undefined1)local_138;
  uStack_1b7 = 0;
  uStack_1b6 = local_138._1_1_;
  uStack_1b5 = 0;
  uStack_1b4 = local_138._2_1_;
  uStack_1b3 = 0;
  uStack_1b2 = local_138._3_1_;
  uStack_1b1 = 0;
  uStack_1b0 = 0;
  uStack_1af = 0;
  uStack_1ae = 0;
  uStack_1ad = 0;
  uStack_1ac = 0;
  uStack_1ab = 0;
  uStack_1aa = 0;
  uStack_1a9 = 0;
  bVar1 = *(byte *)((long)in_RDX + -1);
  local_11a = (ushort)bVar1;
  local_1c8 = (ulong)CONCAT16(bVar1,(uint6)CONCAT14(bVar1,(uint)CONCAT12(bVar1,local_11a)));
  uStack_1c0 = (ulong)CONCAT16(bVar1,(uint6)CONCAT14(bVar1,(uint)CONCAT12(bVar1,local_11a)));
  local_11c = 0x8000;
  local_2a = 0x8000;
  local_2c = 0x8000;
  local_2e = 0x8000;
  local_30 = 0x8000;
  local_32 = 0x8000;
  local_34 = 0x8000;
  local_36 = 0x8000;
  local_38 = 0x8000;
  local_1d8 = 0x8000800080008000;
  uStack_1d0 = 0x8000800080008000;
  local_11e = 1;
  local_2 = 1;
  local_4 = 1;
  local_6 = 1;
  local_8 = 1;
  local_a = 1;
  local_c = 1;
  local_e = 1;
  local_10 = 1;
  local_1e8 = 0x1000100010001;
  uStack_1e0 = 0x1000100010001;
  local_168 = in_RSI;
  local_160 = in_RDI;
  local_138 = uVar13;
  local_88 = ZEXT416(local_6c);
  local_68 = local_1c8;
  uStack_60 = uStack_1c0;
  local_58 = local_11a;
  local_56 = local_11a;
  local_54 = local_11a;
  local_52 = local_11a;
  local_50 = local_11a;
  local_4e = local_11a;
  local_4c = local_11a;
  local_4a = local_11a;
  local_48 = local_1d8;
  uStack_40 = uStack_1d0;
  local_28 = local_1e8;
  uStack_20 = uStack_1e0;
  for (local_1ec = 0; local_1ec < 0x10; local_1ec = local_1ec + 1) {
    local_108 = local_188;
    uStack_100 = uStack_180;
    local_118 = local_1d8;
    uStack_110 = uStack_1d0;
    auVar11._8_8_ = uStack_180;
    auVar11._0_8_ = local_188;
    auVar10._8_8_ = uStack_1d0;
    auVar10._0_8_ = local_1d8;
    local_208 = (__m128i)pshufb(auVar11,auVar10);
    paeth_8x1_pred(&local_208,(__m128i *)&local_1b8,(__m128i *)&local_1c8);
    local_c8 = (short)extraout_XMM0_Qa;
    sStack_c6 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
    sStack_c4 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
    sStack_c2 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
    sStack_c0 = (short)extraout_XMM0_Qb;
    sStack_be = (short)((ulong)extraout_XMM0_Qb >> 0x10);
    sStack_bc = (short)((ulong)extraout_XMM0_Qb >> 0x20);
    sStack_ba = (short)((ulong)extraout_XMM0_Qb >> 0x30);
    local_e8 = (0 < local_c8) * (local_c8 < 0x100) * (char)extraout_XMM0_Qa - (0xff < local_c8);
    cVar2 = (char)((ulong)extraout_XMM0_Qa >> 0x10);
    cStack_e7 = (0 < sStack_c6) * (sStack_c6 < 0x100) * cVar2 - (0xff < sStack_c6);
    cVar3 = (char)((ulong)extraout_XMM0_Qa >> 0x20);
    cStack_e6 = (0 < sStack_c4) * (sStack_c4 < 0x100) * cVar3 - (0xff < sStack_c4);
    cVar4 = (char)((ulong)extraout_XMM0_Qa >> 0x30);
    cStack_e5 = (0 < sStack_c2) * (sStack_c2 < 0x100) * cVar4 - (0xff < sStack_c2);
    cStack_e4 = (0 < sStack_c0) * (sStack_c0 < 0x100) * (char)extraout_XMM0_Qb - (0xff < sStack_c0);
    cVar5 = (char)((ulong)extraout_XMM0_Qb >> 0x10);
    cStack_e3 = (0 < sStack_be) * (sStack_be < 0x100) * cVar5 - (0xff < sStack_be);
    cVar6 = (char)((ulong)extraout_XMM0_Qb >> 0x20);
    cStack_e2 = (0 < sStack_bc) * (sStack_bc < 0x100) * cVar6 - (0xff < sStack_bc);
    cVar7 = (char)((ulong)extraout_XMM0_Qb >> 0x30);
    cStack_e1 = (0 < sStack_ba) * (sStack_ba < 0x100) * cVar7 - (0xff < sStack_ba);
    cStack_e0 = (0 < local_c8) * (local_c8 < 0x100) * (char)extraout_XMM0_Qa - (0xff < local_c8);
    cStack_df = (0 < sStack_c6) * (sStack_c6 < 0x100) * cVar2 - (0xff < sStack_c6);
    cStack_de = (0 < sStack_c4) * (sStack_c4 < 0x100) * cVar3 - (0xff < sStack_c4);
    cStack_dd = (0 < sStack_c2) * (sStack_c2 < 0x100) * cVar4 - (0xff < sStack_c2);
    cStack_dc = (0 < sStack_c0) * (sStack_c0 < 0x100) * (char)extraout_XMM0_Qb - (0xff < sStack_c0);
    cStack_db = (0 < sStack_be) * (sStack_be < 0x100) * cVar5 - (0xff < sStack_be);
    cStack_da = (0 < sStack_bc) * (sStack_bc < 0x100) * cVar6 - (0xff < sStack_bc);
    cStack_d9 = (0 < sStack_ba) * (sStack_ba < 0x100) * cVar7 - (0xff < sStack_ba);
    uVar12 = CONCAT13(cStack_e5,CONCAT12(cStack_e6,CONCAT11(cStack_e7,local_e8)));
    local_f8 = CONCAT17(cStack_e1,CONCAT16(cStack_e2,CONCAT15(cStack_e3,CONCAT14(cStack_e4,uVar12)))
                       );
    uStack_f0 = CONCAT17(cStack_d9,
                         CONCAT16(cStack_da,
                                  CONCAT15(cStack_db,
                                           CONCAT14(cStack_dc,
                                                    CONCAT13(cStack_dd,
                                                             CONCAT12(cStack_de,
                                                                      CONCAT11(cStack_df,cStack_e0))
                                                            )))));
    *local_160 = uVar12;
    local_160 = (undefined4 *)(local_168 + (long)local_160);
    uVar8 = local_1d8;
    uVar9 = uStack_1d0;
    local_a8._0_2_ = (short)local_1d8;
    local_a8._2_2_ = (short)((ulong)local_1d8 >> 0x10);
    local_a8._4_2_ = (short)((ulong)local_1d8 >> 0x20);
    local_a8._6_2_ = (short)((ulong)local_1d8 >> 0x30);
    uStack_a0._0_2_ = (short)uStack_1d0;
    uStack_a0._2_2_ = (short)((ulong)uStack_1d0 >> 0x10);
    uStack_a0._4_2_ = (short)((ulong)uStack_1d0 >> 0x20);
    uStack_a0._6_2_ = (short)((ulong)uStack_1d0 >> 0x30);
    local_b8._0_2_ = (short)local_1e8;
    local_b8._2_2_ = (short)((ulong)local_1e8 >> 0x10);
    local_b8._4_2_ = (short)((ulong)local_1e8 >> 0x20);
    local_b8._6_2_ = (short)((ulong)local_1e8 >> 0x30);
    uStack_b0._0_2_ = (short)uStack_1e0;
    uStack_b0._2_2_ = (short)((ulong)uStack_1e0 >> 0x10);
    uStack_b0._4_2_ = (short)((ulong)uStack_1e0 >> 0x20);
    uStack_b0._6_2_ = (short)((ulong)uStack_1e0 >> 0x30);
    local_1d8 = CONCAT26(local_a8._6_2_ + local_b8._6_2_,
                         CONCAT24(local_a8._4_2_ + local_b8._4_2_,
                                  CONCAT22(local_a8._2_2_ + local_b8._2_2_,
                                           (short)local_a8 + (short)local_b8)));
    uStack_1d0 = CONCAT26(uStack_a0._6_2_ + uStack_b0._6_2_,
                          CONCAT24(uStack_a0._4_2_ + uStack_b0._4_2_,
                                   CONCAT22(uStack_a0._2_2_ + uStack_b0._2_2_,
                                            (short)uStack_a0 + (short)uStack_b0)));
    local_b8 = local_1e8;
    uStack_b0 = uStack_1e0;
    local_a8 = uVar8;
    uStack_a0 = uVar9;
  }
  return;
}

Assistant:

void aom_paeth_predictor_4x16_ssse3(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  __m128i l = _mm_load_si128((const __m128i *)left);
  const __m128i t = _mm_cvtsi32_si128(((const int *)above)[0]);
  const __m128i zero = _mm_setzero_si128();
  const __m128i t16 = _mm_unpacklo_epi8(t, zero);
  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);

  for (int i = 0; i < 16; ++i) {
    const __m128i l16 = _mm_shuffle_epi8(l, rep);
    const __m128i row = paeth_8x1_pred(&l16, &t16, &tl16);

    *(int *)dst = _mm_cvtsi128_si32(_mm_packus_epi16(row, row));
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}